

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O3

bool __thiscall
re2::TestInstance::RunCase(TestInstance *this,StringPiece *text,StringPiece *context,Anchor anchor)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  undefined1 *puVar5;
  string *psVar6;
  ulong uVar7;
  uint32 uVar8;
  long lVar9;
  ostream *poVar10;
  ulong uVar11;
  bool bVar12;
  ParseFlags flags;
  StringPiece *src;
  char *pcVar13;
  ulong uVar14;
  _Alloc_hider _Var15;
  long lVar16;
  StringPiece *orig_context;
  Engine type;
  Result r;
  Result correct;
  string local_450;
  StringPiece *local_430;
  Anchor local_424;
  string local_420;
  string local_400;
  Result local_3e0;
  LogMessage local_2c8;
  Result local_148;
  
  lVar9 = 0x10;
  do {
    *(undefined8 *)((long)(local_148.submatch + -1) + lVar9) = 0;
    *(undefined4 *)((long)local_148.submatch + lVar9 + -8) = 0;
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 0x120);
  local_430 = context;
  RunSearch(this,kEngineBacktrack,text,context,anchor,&local_148);
  if (local_148.skipped == false) {
    type = kEngineNFA;
    bVar12 = true;
    orig_context = local_430;
    local_424 = anchor;
    do {
      uVar8 = Engines();
      if ((uVar8 >> (type & 0x1f) & 1) == 0) goto LAB_0011ef5c;
      lVar9 = 0x10;
      do {
        *(undefined8 *)((long)(local_3e0.submatch + -1) + lVar9) = 0;
        *(undefined4 *)((long)local_3e0.submatch + lVar9 + -8) = 0;
        lVar9 = lVar9 + 0x10;
      } while (lVar9 != 0x120);
      RunSearch(this,type,text,orig_context,anchor,&local_3e0);
      if (local_3e0.skipped == false) {
        if (local_3e0.matched == local_148.matched) {
          if ((local_3e0.have_submatch != false) || (local_3e0.have_submatch0 == true)) {
            lVar9 = 0x10;
            do {
              if (*(long *)((long)(local_148.submatch + -1) + lVar9) !=
                  *(long *)((long)(local_3e0.submatch + -1) + lVar9)) goto LAB_0011ec97;
              iVar1 = *(int *)((long)local_148.submatch + lVar9 + -8);
              iVar2 = *(int *)((long)local_3e0.submatch + lVar9 + -8);
              if ((iVar1 != iVar2) || (local_3e0.have_submatch == false)) {
                if (iVar1 != iVar2) goto LAB_0011ec97;
                break;
              }
              lVar9 = lVar9 + 0x10;
            } while (lVar9 != 0x120);
          }
          goto LAB_0011ebea;
        }
LAB_0011ec97:
        if ((type == kEnginePCRE) && (uVar11 = (ulong)text->length_, 0 < (long)uVar11)) {
          if (-1 < *text->ptr_) {
            uVar7 = 1;
            do {
              uVar14 = uVar7;
              if (uVar11 == uVar14) break;
              uVar7 = uVar14 + 1;
            } while (-1 < text->ptr_[uVar14]);
            if (uVar11 <= uVar14) goto LAB_0011ece1;
          }
        }
        else {
LAB_0011ece1:
          bVar12 = (bool)(bVar12 & local_3e0.untrusted);
          pcVar13 = "Mismatch: ";
          if (local_3e0.untrusted != false) {
            pcVar13 = "(Untrusted) Mismatch: ";
          }
          LogMatch(this,pcVar13,type,text,orig_context,anchor);
          if (local_3e0.matched != local_148.matched) {
            if (local_3e0.matched == false) {
              LogMessage::LogMessage
                        (&local_2c8,
                         "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
                         ,0x21a,0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_2c8.str_,"   Should match (but does not).",0x1f);
              LogMessage::~LogMessage(&local_2c8);
              goto LAB_0011ef5c;
            }
            LogMessage::LogMessage
                      (&local_2c8,
                       "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
                       ,0x218,0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_2c8.str_,"   Should not match (but does).",0x1f);
            LogMessage::~LogMessage(&local_2c8);
          }
          if (-1 < this->num_captures_) {
            lVar9 = -1;
            lVar16 = 0x10;
            do {
              lVar3 = *(long *)((long)(local_3e0.submatch + -1) + lVar16);
              lVar4 = *(long *)((long)(local_148.submatch + -1) + lVar16);
              if ((lVar3 == lVar4) &&
                 (lVar3 + *(int *)((long)local_3e0.submatch + lVar16 + -8) ==
                  lVar4 + *(int *)((long)local_148.submatch + lVar16 + -8))) {
                LogMessage::LogMessage
                          (&local_2c8,
                           "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
                           ,0x227,0);
                FormatCapture_abi_cxx11_
                          (&local_420,(re2 *)text->ptr_,
                           *(StringPiece **)((long)(local_3e0.submatch + -1) + lVar16),
                           (StringPiece *)(ulong)*(uint *)((long)local_3e0.submatch + lVar16 + -8));
                StringPrintf_abi_cxx11_
                          (&local_450,"   $%d: %s ok",(ulong)((int)lVar9 + 1),
                           local_420._M_dataplus._M_p);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_2c8.str_,local_450._M_dataplus._M_p,
                           local_450._M_string_length);
                psVar6 = &local_450;
                _Var15._M_p = local_450._M_dataplus._M_p;
              }
              else {
                LogMessage::LogMessage
                          (&local_2c8,
                           "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
                           ,0x221,0);
                FormatCapture_abi_cxx11_
                          (&local_420,(re2 *)text->ptr_,
                           *(StringPiece **)((long)(local_148.submatch + -1) + lVar16),
                           (StringPiece *)(ulong)*(uint *)((long)local_148.submatch + lVar16 + -8));
                _Var15._M_p = local_420._M_dataplus._M_p;
                FormatCapture_abi_cxx11_
                          (&local_400,(re2 *)text->ptr_,
                           *(StringPiece **)((long)(local_3e0.submatch + -1) + lVar16),
                           (StringPiece *)(ulong)*(uint *)((long)local_3e0.submatch + lVar16 + -8));
                StringPrintf_abi_cxx11_
                          (&local_450,"   $%d: should be %s is %s",(ulong)((int)lVar9 + 1),
                           _Var15._M_p,local_400._M_dataplus._M_p);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_2c8.str_,local_450._M_dataplus._M_p,
                           local_450._M_string_length);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_450._M_dataplus._M_p != &local_450.field_2) {
                  operator_delete(local_450._M_dataplus._M_p);
                }
                psVar6 = &local_400;
                _Var15._M_p = local_400._M_dataplus._M_p;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var15._M_p != &psVar6->field_2) {
                operator_delete(_Var15._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_420._M_dataplus._M_p != &local_420.field_2) {
                operator_delete(local_420._M_dataplus._M_p);
              }
              LogMessage::~LogMessage(&local_2c8);
              lVar9 = lVar9 + 1;
              lVar16 = lVar16 + 0x10;
              orig_context = local_430;
              anchor = local_424;
            } while (lVar9 < this->num_captures_);
          }
        }
      }
      else {
LAB_0011ebea:
        if (FLAGS_log_okay == '\x01') {
          pcVar13 = "Okay: ";
          if (local_3e0.skipped != false) {
            pcVar13 = "Skipped: ";
          }
          LogMatch(this,pcVar13,type,text,orig_context,anchor);
        }
      }
LAB_0011ef5c:
      type = type + kEngineNFA;
    } while (type != kEngineMax);
    if (FLAGS_max_regexp_failures < 1 || bVar12 != false) {
      return bVar12;
    }
    FLAGS_max_regexp_failures = FLAGS_max_regexp_failures + -1;
    if (FLAGS_max_regexp_failures == 0) {
      LogMessage::LogMessage
                (&local_2c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
                 ,0x230,3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_2c8.str_,"Too many regexp failures.",0x19);
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2c8);
    }
  }
  else {
    if (this->regexp_ == (Regexp *)0x0) {
      return true;
    }
    LogMessage::LogMessage
              (&local_2c8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
               ,0x1f0,2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2c8.str_,"Skipped backtracking! ",0x16);
    CEscape_abi_cxx11_((string *)&local_3e0,(re2 *)this->regexp_str_,src);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_2c8.str_,
                         (char *)CONCAT44(local_3e0._4_4_,
                                          CONCAT13(local_3e0.have_submatch,
                                                   CONCAT12(local_3e0.untrusted,
                                                            CONCAT11(local_3e0.matched,
                                                                     local_3e0.skipped)))),
                         (long)local_3e0.submatch[0].ptr_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
    FormatMode_abi_cxx11_(&local_450,(re2 *)(ulong)this->flags_,flags);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,local_450._M_dataplus._M_p,local_450._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p);
    }
    puVar5 = (undefined1 *)
             CONCAT44(local_3e0._4_4_,
                      CONCAT13(local_3e0.have_submatch,
                               CONCAT12(local_3e0.untrusted,
                                        CONCAT11(local_3e0.matched,local_3e0.skipped))));
    if ((int *)puVar5 != &local_3e0.submatch[0].length_) {
      operator_delete(puVar5);
    }
    LogMessage::~LogMessage(&local_2c8);
  }
  return false;
}

Assistant:

bool TestInstance::RunCase(const StringPiece& text, const StringPiece& context,
                           Prog::Anchor anchor) {
  // Backtracking is the gold standard.
  Result correct;
  RunSearch(kEngineBacktrack, text, context, anchor, &correct);
  if (correct.skipped) {
    if (regexp_ == NULL)
      return true;
    LOG(ERROR) << "Skipped backtracking! " << CEscape(regexp_str_)
               << " " << FormatMode(flags_);
    return false;
  }
  VLOG(1) << "Try: regexp " << CEscape(regexp_str_)
          << " text " << CEscape(text)
          << " (" << FormatKind(kind_)
          << ", " << FormatAnchor(anchor)
          << ", " << FormatMode(flags_)
          << ")";

  // Compare the others.
  bool all_okay = true;
  for (Engine i = kEngineBacktrack+1; i < kEngineMax; i++) {
    if (!(Engines() & (1<<i)))
      continue;

    Result r;
    RunSearch(i, text, context, anchor, &r);
    if (ResultOkay(r, correct)) {
      if (FLAGS_log_okay)
        LogMatch(r.skipped ? "Skipped: " : "Okay: ", i, text, context, anchor);
      continue;
    }

    // We disagree with PCRE on the meaning of some Unicode matches.
    // In particular, we treat non-ASCII UTF-8 as non-word characters.
    // We also treat "empty" character sets like [^\w\W] as being
    // impossible to match, while PCRE apparently excludes some code
    // points (e.g., 0x0080) from both \w and \W.
    if (i == kEnginePCRE && NonASCII(text))
      continue;

    if (!r.untrusted)
      all_okay = false;

    LogMatch(r.untrusted ? "(Untrusted) Mismatch: " : "Mismatch: ", i, text,
             context, anchor);
    if (r.matched != correct.matched) {
      if (r.matched) {
        LOG(INFO) << "   Should not match (but does).";
      } else {
        LOG(INFO) << "   Should match (but does not).";
        continue;
      }
    }
    for (int i = 0; i < 1+num_captures_; i++) {
      if (r.submatch[i].begin() != correct.submatch[i].begin() ||
          r.submatch[i].end() != correct.submatch[i].end()) {
        LOG(INFO) <<
          StringPrintf("   $%d: should be %s is %s",
                       i,
                       FormatCapture(text, correct.submatch[i]).c_str(),
                       FormatCapture(text, r.submatch[i]).c_str());
      } else {
        LOG(INFO) <<
          StringPrintf("   $%d: %s ok", i,
                       FormatCapture(text, r.submatch[i]).c_str());
      }
    }
  }

  if (!all_okay) {
    if (FLAGS_max_regexp_failures > 0 && --FLAGS_max_regexp_failures == 0)
      LOG(QFATAL) << "Too many regexp failures.";
  }

  return all_okay;
}